

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O2

void __thiscall ncnn::Blob::Blob(Blob *this,Blob *param_1)

{
  int iVar1;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar1 = param_1->consumer;
  this->producer = param_1->producer;
  this->consumer = iVar1;
  Mat::Mat(&this->shape,&param_1->shape);
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}